

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O2

uint256 * __thiscall
XOnlyPubKey::ComputeTapTweakHash
          (uint256 *__return_storage_ptr__,XOnlyPubKey *this,uint256 *merkle_root)

{
  long lVar1;
  uint32_t *puVar2;
  HashWriter *pHVar3;
  long in_FS_OFFSET;
  HashWriter HStack_88;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (merkle_root == (uint256 *)0x0) {
    puVar2 = (uint32_t *)&HASHER_TAPTWEAK;
    pHVar3 = &HStack_88;
    for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)pHVar3 = *(undefined8 *)puVar2;
      puVar2 = puVar2 + 2;
      pHVar3 = (HashWriter *)((long)pHVar3 + 8);
    }
    base_blob<256U>::Serialize<HashWriter>((base_blob<256U> *)this,&HStack_88);
  }
  else {
    puVar2 = (uint32_t *)&HASHER_TAPTWEAK;
    pHVar3 = &HStack_88;
    for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)pHVar3 = *(undefined8 *)puVar2;
      puVar2 = puVar2 + 2;
      pHVar3 = (HashWriter *)((long)pHVar3 + 8);
    }
    base_blob<256U>::Serialize<HashWriter>((base_blob<256U> *)this,&HStack_88);
    base_blob<256U>::Serialize<HashWriter>(&merkle_root->super_base_blob<256U>,&HStack_88);
  }
  HashWriter::GetSHA256(__return_storage_ptr__,&HStack_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

uint256 XOnlyPubKey::ComputeTapTweakHash(const uint256* merkle_root) const
{
    if (merkle_root == nullptr) {
        // We have no scripts. The actual tweak does not matter, but follow BIP341 here to
        // allow for reproducible tweaking.
        return (HashWriter{HASHER_TAPTWEAK} << m_keydata).GetSHA256();
    } else {
        return (HashWriter{HASHER_TAPTWEAK} << m_keydata << *merkle_root).GetSHA256();
    }
}